

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 unqliteCoreConfigure(sxi32 nOp,__va_list_tag *ap)

{
  uint uVar1;
  undefined8 *local_f0;
  undefined8 *local_d8;
  undefined8 *local_c0;
  long *local_a8;
  long *local_90;
  uint *local_78;
  void *pUserData;
  ProcMemError xMemErr_1;
  void *pMemErr;
  ProcMemError xMemErr;
  SyMemMethods *pMethods_1;
  unqlite_vfs *pVfs;
  unqlite_kv_methods *pMethods;
  int iPage;
  int rc;
  __va_list_tag *ap_local;
  sxi32 nOp_local;
  
  pMethods._4_4_ = 0;
  uVar1 = sUnqlMPGlobal.iPageSize;
  _iPage = ap;
  ap_local._4_4_ = nOp;
  switch(nOp) {
  case 1:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_c0 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_c0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_c0 + 1;
    }
    if ((SyMemMethods *)*local_c0 == (SyMemMethods *)0x0) {
      pMethods._4_4_ =
           SyMemBackendInit(&sUnqlMPGlobal.sAllocator,sUnqlMPGlobal.sAllocator.xMemError,
                            sUnqlMPGlobal.sAllocator.pUserData);
      uVar1 = sUnqlMPGlobal.iPageSize;
    }
    else {
      pMethods._4_4_ =
           SyMemBackendInitFromOthers
                     (&sUnqlMPGlobal.sAllocator,(SyMemMethods *)*local_c0,
                      sUnqlMPGlobal.sAllocator.xMemError,sUnqlMPGlobal.sAllocator.pUserData);
      uVar1 = sUnqlMPGlobal.iPageSize;
    }
    break;
  case 2:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_d8 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_d8 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_d8 + 1;
    }
    sUnqlMPGlobal.sAllocator.xMemError = (ProcMemError)*local_d8;
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_f0 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_f0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_f0 + 1;
    }
    sUnqlMPGlobal.sAllocator.pUserData = (void *)*local_f0;
    uVar1 = sUnqlMPGlobal.iPageSize;
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_a8 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_a8 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_a8 + 1;
    }
    uVar1 = sUnqlMPGlobal.iPageSize;
    if ((unqlite_vfs *)*local_a8 != (unqlite_vfs *)0x0) {
      sUnqlMPGlobal.pVfs = (unqlite_vfs *)*local_a8;
    }
    break;
  case 7:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_90 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_90 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_90 + 1;
    }
    pVfs = (unqlite_vfs *)*local_90;
    if ((((((pVfs == (unqlite_vfs *)0x0) || (pVfs->zName == (char *)0x0)) || (*pVfs->zName == '\0'))
         || ((pVfs->xGetLastError == (_func_int_unqlite_vfs_ptr_int_char_ptr *)0x0 ||
             (pVfs[1].xCurrentTime == (_func_int_unqlite_vfs_ptr_Sytm_ptr *)0x0)))) ||
        ((pVfs[1].xTmpDir == (_func_int_unqlite_vfs_ptr_char_ptr_int *)0x0 ||
         ((pVfs[1].xSleep == (_func_int_unqlite_vfs_ptr_int *)0x0 ||
          (pVfs[1].xFullPathname == (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0)))))) ||
       (pVfs->iVersion < 8)) {
      pMethods._4_4_ = -9;
      uVar1 = sUnqlMPGlobal.iPageSize;
    }
    else {
      pMethods._4_4_ = SySetPut(&sUnqlMPGlobal.kv_storage,&pVfs);
      uVar1 = sUnqlMPGlobal.iPageSize;
    }
    break;
  case 8:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_78 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_78 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_78 + 2;
    }
    uVar1 = *local_78;
    if (((int)uVar1 < 0x200) || (0x10000 < (int)uVar1)) {
      pMethods._4_4_ = -9;
      uVar1 = sUnqlMPGlobal.iPageSize;
    }
    else if ((uVar1 & uVar1 - 1) != 0) {
      pMethods._4_4_ = -9;
      uVar1 = sUnqlMPGlobal.iPageSize;
    }
    break;
  default:
    pMethods._4_4_ = -0x18;
  }
  sUnqlMPGlobal.iPageSize = uVar1;
  return pMethods._4_4_;
}

Assistant:

static sxi32 unqliteCoreConfigure(sxi32 nOp, va_list ap)
{
	int rc = UNQLITE_OK;
	switch(nOp){
	    case UNQLITE_LIB_CONFIG_PAGE_SIZE: {
			/* Default page size: Must be a power of two */
			int iPage = va_arg(ap,int);
			if( iPage >= UNQLITE_MIN_PAGE_SIZE && iPage <= UNQLITE_MAX_PAGE_SIZE ){
				if( !(iPage & (iPage - 1)) ){
					sUnqlMPGlobal.iPageSize = iPage;
				}else{
					/* Invalid page size */
					rc = UNQLITE_INVALID;
				}
			}else{
				/* Invalid page size */
				rc = UNQLITE_INVALID;
			}
			break;
										   }
	    case UNQLITE_LIB_CONFIG_STORAGE_ENGINE: {
			/* Install a key value storage engine */
			unqlite_kv_methods *pMethods = va_arg(ap,unqlite_kv_methods *);
			/* Make sure we are delaing with a valid methods */
			if( pMethods == 0 || SX_EMPTY_STR(pMethods->zName) || pMethods->xSeek == 0 || pMethods->xData == 0
				|| pMethods->xKey == 0 || pMethods->xDataLength == 0 || pMethods->xKeyLength == 0 
				|| pMethods->szKv < (int)sizeof(unqlite_kv_engine) ){
					rc = UNQLITE_INVALID;
					break;
			}
			/* Install it */
			rc = SySetPut(&sUnqlMPGlobal.kv_storage,(const void *)&pMethods);
			break;
												}
	    case UNQLITE_LIB_CONFIG_VFS:{
			/* Install a virtual file system */
			unqlite_vfs *pVfs = va_arg(ap,unqlite_vfs *);
			if( pVfs ){
			 sUnqlMPGlobal.pVfs = pVfs;
			}
			break;
								}
		case UNQLITE_LIB_CONFIG_USER_MALLOC: {
			/* Use an alternative low-level memory allocation routines */
			const SyMemMethods *pMethods = va_arg(ap, const SyMemMethods *);
			/* Save the memory failure callback (if available) */
			ProcMemError xMemErr = sUnqlMPGlobal.sAllocator.xMemError;
			void *pMemErr = sUnqlMPGlobal.sAllocator.pUserData;
			if( pMethods == 0 ){
				/* Use the built-in memory allocation subsystem */
				rc = SyMemBackendInit(&sUnqlMPGlobal.sAllocator, xMemErr, pMemErr);
			}else{
				rc = SyMemBackendInitFromOthers(&sUnqlMPGlobal.sAllocator, pMethods, xMemErr, pMemErr);
			}
			break;
										  }
		case UNQLITE_LIB_CONFIG_MEM_ERR_CALLBACK: {
			/* Memory failure callback */
			ProcMemError xMemErr = va_arg(ap, ProcMemError);
			void *pUserData = va_arg(ap, void *);
			sUnqlMPGlobal.sAllocator.xMemError = xMemErr;
			sUnqlMPGlobal.sAllocator.pUserData = pUserData;
			break;
												 }	  
		case UNQLITE_LIB_CONFIG_USER_MUTEX: {
#if defined(UNQLITE_ENABLE_THREADS)
			/* Use an alternative low-level mutex subsystem */
			const SyMutexMethods *pMethods = va_arg(ap, const SyMutexMethods *);
#if defined (UNTRUST)
			if( pMethods == 0 ){
				rc = UNQLITE_CORRUPT;
			}
#endif
			/* Sanity check */
			if( pMethods->xEnter == 0 || pMethods->xLeave == 0 || pMethods->xNew == 0){
				/* At least three criticial callbacks xEnter(), xLeave() and xNew() must be supplied */
				rc = UNQLITE_CORRUPT;
				break;
			}
			if( sUnqlMPGlobal.pMutexMethods ){
				/* Overwrite the previous mutex subsystem */
				SyMutexRelease(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex);
				if( sUnqlMPGlobal.pMutexMethods->xGlobalRelease ){
					sUnqlMPGlobal.pMutexMethods->xGlobalRelease();
				}
				sUnqlMPGlobal.pMutex = 0;
			}
			/* Initialize and install the new mutex subsystem */
			if( pMethods->xGlobalInit ){
				rc = pMethods->xGlobalInit();
				if ( rc != UNQLITE_OK ){
					break;
				}
			}
			/* Create the global mutex */
			sUnqlMPGlobal.pMutex = pMethods->xNew(SXMUTEX_TYPE_FAST);
			if( sUnqlMPGlobal.pMutex == 0 ){
				/*
				 * If the supplied mutex subsystem is so sick that we are unable to
				 * create a single mutex, there is no much we can do here.
				 */
				if( pMethods->xGlobalRelease ){
					pMethods->xGlobalRelease();
				}
				rc = UNQLITE_CORRUPT;
				break;
			}
			sUnqlMPGlobal.pMutexMethods = pMethods;			
			if( sUnqlMPGlobal.nThreadingLevel == 0 ){
				/* Set a default threading level */
				sUnqlMPGlobal.nThreadingLevel = UNQLITE_THREAD_LEVEL_MULTI; 
			}
#endif
			break;
										   }
		case UNQLITE_LIB_CONFIG_THREAD_LEVEL_SINGLE:
#if defined(UNQLITE_ENABLE_THREADS)
			/* Single thread mode (Only one thread is allowed to play with the library) */
			sUnqlMPGlobal.nThreadingLevel = UNQLITE_THREAD_LEVEL_SINGLE;
			jx9_lib_config(JX9_LIB_CONFIG_THREAD_LEVEL_SINGLE);
#endif
			break;
		case UNQLITE_LIB_CONFIG_THREAD_LEVEL_MULTI:
#if defined(UNQLITE_ENABLE_THREADS)
			/* Multi-threading mode (library is thread safe and database handles and virtual machines
			 * may be shared between multiple threads).
			 */
			sUnqlMPGlobal.nThreadingLevel = UNQLITE_THREAD_LEVEL_MULTI;
			jx9_lib_config(JX9_LIB_CONFIG_THREAD_LEVEL_MULTI);
#endif
			break;
		default:
			/* Unknown configuration option */
			rc = UNQLITE_CORRUPT;
			break;
	}
	return rc;
}